

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

void absl::debugging_internal::Append(State *state,char *str,size_t length)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t i;
  size_t length_local;
  char *str_local;
  State *state_local;
  
  i = 0;
  do {
    if (length <= i) {
LAB_003b245e:
      if ((state->parse_state).out_cur_idx < state->out_end_idx) {
        state->out[(state->parse_state).out_cur_idx] = '\0';
      }
      return;
    }
    if (state->out_end_idx <= (state->parse_state).out_cur_idx + 1) {
      (state->parse_state).out_cur_idx = state->out_end_idx + 1;
      goto LAB_003b245e;
    }
    cVar1 = str[i];
    pcVar3 = state->out;
    iVar2 = (state->parse_state).out_cur_idx;
    (state->parse_state).out_cur_idx = iVar2 + 1;
    pcVar3[iVar2] = cVar1;
    i = i + 1;
  } while( true );
}

Assistant:

static void Append(State *state, const char *const str, const size_t length) {
  for (size_t i = 0; i < length; ++i) {
    if (state->parse_state.out_cur_idx + 1 <
        state->out_end_idx) {  // +1 for '\0'
      state->out[state->parse_state.out_cur_idx++] = str[i];
    } else {
      // signal overflow
      state->parse_state.out_cur_idx = state->out_end_idx + 1;
      break;
    }
  }
  if (state->parse_state.out_cur_idx < state->out_end_idx) {
    state->out[state->parse_state.out_cur_idx] =
        '\0';  // Terminate it with '\0'
  }
}